

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *containing_type,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  long lVar2;
  KeyValue *it_1;
  KeyValue *pKVar3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_38;
  anon_class_24_3_67308ef9 local_30;
  
  local_30.output = &local_38;
  pKVar3 = (this->map_).flat;
  local_38 = output;
  local_30.containing_type = containing_type;
  local_30.pool = pool;
  if (this->flat_capacity_ < 0x101) {
    for (lVar2 = (ulong)this->flat_size_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
      AppendToList::anon_class_24_3_67308ef9::operator()(&local_30,pKVar3->first,&pKVar3->second);
      pKVar3 = pKVar3 + 1;
    }
  }
  else {
    local_30.output = &local_38;
    for (p_Var1 = (_Rb_tree_node_base *)(pKVar3->second).descriptor;
        p_Var1 != (_Rb_tree_node_base *)&pKVar3->second;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      AppendToList::anon_class_24_3_67308ef9::operator()
                (&local_30,p_Var1[1]._M_color,(Extension *)&p_Var1[1]._M_parent);
    }
  }
  return;
}

Assistant:

void ExtensionSet::AppendToList(
    const Descriptor* containing_type, const DescriptorPool* pool,
    std::vector<const FieldDescriptor*>* output) const {
  ForEach([containing_type, pool, &output](int number, const Extension& ext) {
    bool has = false;
    if (ext.is_repeated) {
      has = ext.GetSize() > 0;
    } else {
      has = !ext.is_cleared;
    }

    if (has) {
      // TODO(kenton): Looking up each field by number is somewhat unfortunate.
      //   Is there a better way?  The problem is that descriptors are lazily-
      //   initialized, so they might not even be constructed until
      //   AppendToList() is called.

      if (ext.descriptor == NULL) {
        output->push_back(pool->FindExtensionByNumber(containing_type, number));
      } else {
        output->push_back(ext.descriptor);
      }
    }
  });
}